

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::EvaluateSectionDisplacement
          (ChElementBeamTaperedTimoshenkoFPM *this,double eta,ChVector<double> *u_displ,
          ChVector<double> *u_rotaz)

{
  Scalar *pSVar1;
  ChVectorDynamic<> u_vector;
  ChVectorDynamic<> displ;
  ShapeFunctionGroupFPM NxBx;
  ChMatrixNM<double,_6,_12> Nx;
  void *local_778 [2];
  double local_768;
  Matrix<double,__1,_1,_0,__1,_1> local_760;
  Product<Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_750;
  ShapeFunctionGroupFPM local_740;
  MatrixBase<Eigen::Matrix<double,6,12,1,6,12>> local_2c0 [664];
  
  local_768 = eta;
  local_740.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array[0]._0_4_ =
       (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
         super_ChElementBase._vptr_ChElementBase[3])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_760,(int *)&local_740);
  (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
    super_ChElementBase._vptr_ChElementBase[6])(this,&local_760);
  ShapeFunctionsTimoshenkoFPM(this,&local_740,local_768);
  memcpy(local_2c0,
         &local_740.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>
          .super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>,0x240);
  local_750 = Eigen::MatrixBase<Eigen::Matrix<double,6,12,1,6,12>>::operator*
                        (local_2c0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_760
                        );
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,12,1,6,12>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_778,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_750);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_778,0);
  u_displ->m_data[0] = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_778,1);
  u_displ->m_data[1] = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_778,2);
  u_displ->m_data[2] = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_778,3);
  u_rotaz->m_data[0] = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_778,4);
  u_rotaz->m_data[1] = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_778,5);
  u_rotaz->m_data[2] = *pSVar1;
  Eigen::internal::handmade_aligned_free(local_778[0]);
  Eigen::internal::handmade_aligned_free
            (local_760.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenkoFPM::EvaluateSectionDisplacement(const double eta,
                                                                    ChVector<>& u_displ,
                                                                    ChVector<>& u_rotaz) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);
    // No transformation for the displacement of two nodes,
    // so the section displacement is evaluated at the centerline of beam

    ShapeFunctionGroupFPM NxBx;
    ShapeFunctionsTimoshenkoFPM(NxBx, eta);
    // the shape function matrix
    ChMatrixNM<double, 6, 12> Nx = std::get<0>(NxBx);

    // the displacements and rotations, as a vector
    ChVectorDynamic<> u_vector = Nx * displ;

    u_displ.x() = u_vector(0);
    u_displ.y() = u_vector(1);
    u_displ.z() = u_vector(2);
    u_rotaz.x() = u_vector(3);
    u_rotaz.y() = u_vector(4);
    u_rotaz.z() = u_vector(5);
}